

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_ipp.hpp
# Opt level: O0

type __thiscall
duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
          (shared_ptr<duckdb::ClientContext,_true> *this)

{
  element_type *peVar1;
  __shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  element_type *ptr;
  bool in_stack_00000037;
  
  peVar1 = ::std::__shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>::get(in_RDI);
  AssertNotNull(in_stack_00000037);
  return peVar1;
}

Assistant:

typename std::add_lvalue_reference<T>::type operator*() const {
		if (MemorySafety<SAFE>::ENABLED) {
			const auto ptr = internal.get();
			AssertNotNull(!ptr);
			return *ptr;
		} else {
			return *internal;
		}
	}